

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O3

void __thiscall TPZFMatrix<Fad<float>_>::InitializePivot(TPZFMatrix<Fad<float>_> *this)

{
  int *piVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  long newsize;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  newsize = (long)(int)(this->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow;
  TPZManVector<int,_5>::Resize(&this->fPivot,newsize);
  auVar2 = _DAT_014d28c0;
  if (0 < newsize) {
    piVar1 = (this->fPivot).super_TPZVec<int>.fStore;
    lVar4 = newsize + -1;
    auVar5._8_4_ = (int)lVar4;
    auVar5._0_8_ = lVar4;
    auVar5._12_4_ = (int)((ulong)lVar4 >> 0x20);
    uVar3 = 0;
    auVar5 = auVar5 ^ _DAT_014d28c0;
    auVar6 = _DAT_014d28b0;
    do {
      auVar7 = auVar6 ^ auVar2;
      lVar4 = auVar6._8_8_;
      if ((bool)(~(auVar7._4_4_ == auVar5._4_4_ && auVar5._0_4_ < auVar7._0_4_ ||
                  auVar5._4_4_ < auVar7._4_4_) & 1)) {
        piVar1[uVar3] = (int)(auVar6._0_8_ + 1);
      }
      if ((auVar7._12_4_ != auVar5._12_4_ || auVar7._8_4_ <= auVar5._8_4_) &&
          auVar7._12_4_ <= auVar5._12_4_) {
        piVar1[uVar3 + 1] = (int)(lVar4 + 1);
      }
      uVar3 = uVar3 + 2;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar4 + 2;
    } while ((newsize + 1U & 0x7ffffffffffffffe) != uVar3);
  }
  return;
}

Assistant:

void TPZFMatrix<TVar>::InitializePivot()
{
    const int nRows = this->Rows();
    fPivot.Resize(nRows);
    for(int64_t i = 0; i < nRows; i++){
        fPivot[i] = i+1; // Fortran based indexing
    }
}